

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor *
ggml_rope_multi(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,ggml_tensor *c,int n_dims,
               int *sections,int mode,int n_ctx_orig,float freq_base,float freq_scale,
               float ext_factor,float attn_factor,float beta_fast,float beta_slow)

{
  _Bool _Var1;
  ggml_tensor *in_RCX;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  int in_R8D;
  undefined8 *in_R9;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM3_Da;
  undefined4 in_XMM4_Da;
  undefined4 in_XMM5_Da;
  uint in_stack_00000008;
  int32_t params [15];
  ggml_tensor *result;
  ggml_tensor *in_stack_ffffffffffffff58;
  ggml_tensor *in_stack_ffffffffffffff60;
  undefined1 local_98 [4];
  int local_94;
  undefined4 local_84;
  undefined4 local_80;
  undefined4 local_7c;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined8 local_6c;
  undefined8 local_64;
  ggml_tensor *local_50;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined8 *local_30;
  int local_24;
  ggml_tensor *local_20;
  ggml_tensor *local_18;
  ggml_tensor *local_10;
  
  if ((in_stack_00000008 & 1) != 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0xe22
               ,"GGML_ASSERT(%s) failed",
               "(mode & 1) == 0 && \"mode & 1 == 1 is no longer supported\"");
  }
  local_48 = in_XMM5_Da;
  local_44 = in_XMM4_Da;
  local_40 = in_XMM3_Da;
  local_3c = in_XMM2_Da;
  local_38 = in_XMM1_Da;
  local_34 = in_XMM0_Da;
  local_30 = in_R9;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  _Var1 = ggml_is_vector(in_RDX);
  if (!_Var1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0xe24
               ,"GGML_ASSERT(%s) failed","ggml_is_vector(b)");
  }
  if (local_18->type != GGML_TYPE_I32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0xe25
               ,"GGML_ASSERT(%s) failed","b->type == GGML_TYPE_I32");
  }
  if (local_10->ne[2] << 2 != local_18->ne[0]) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0xe26
               ,"GGML_ASSERT(%s) failed","a->ne[2] * 4 == b->ne[0]");
  }
  if (local_20 != (ggml_tensor *)0x0) {
    if (local_20->type != GGML_TYPE_F32) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
                 0xe29,"GGML_ASSERT(%s) failed","c->type == GGML_TYPE_F32");
    }
    in_stack_ffffffffffffff60 = (ggml_tensor *)local_20->ne[0];
    if ((long)in_stack_ffffffffffffff60 < (long)(local_24 / 2)) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
                 0xe2a,"GGML_ASSERT(%s) failed","c->ne[0] >= n_dims / 2");
    }
  }
  local_50 = ggml_dup_tensor((ggml_context *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  memset(local_98,0,0x3c);
  local_94 = local_24;
  local_84 = local_34;
  local_80 = local_38;
  local_7c = local_3c;
  local_78 = local_40;
  local_74 = local_44;
  local_70 = local_48;
  local_6c = *local_30;
  local_64 = local_30[1];
  ggml_set_op_params(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0x14f732);
  local_50->op = GGML_OP_ROPE;
  local_50->src[0] = local_10;
  local_50->src[1] = local_18;
  local_50->src[2] = local_20;
  return local_50;
}

Assistant:

struct ggml_tensor * ggml_rope_multi(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        struct ggml_tensor  * c,
        int                   n_dims,
        int                   sections[4],
        int                   mode,
        int                   n_ctx_orig,
        float                 freq_base,
        float                 freq_scale,
        float                 ext_factor,
        float                 attn_factor,
        float                 beta_fast,
        float                 beta_slow) {
    // Multimodal Rotary Position Embedding
    GGML_ASSERT((mode & 1) == 0 && "mode & 1 == 1 is no longer supported");

    GGML_ASSERT(ggml_is_vector(b));
    GGML_ASSERT(b->type == GGML_TYPE_I32);
    GGML_ASSERT(a->ne[2] * 4 == b->ne[0]); // mrope expecting 4 position ids per token

    if (c) {
        GGML_ASSERT(c->type == GGML_TYPE_F32);
        GGML_ASSERT(c->ne[0] >= n_dims / 2);
    }

    struct ggml_tensor * result = ggml_dup_tensor(ctx, a);

    int32_t params[11 + 4] = { /*n_past*/ 0, n_dims, mode, /*n_ctx*/ 0, n_ctx_orig };
    memcpy(params +  5, &freq_base,    sizeof(float));
    memcpy(params +  6, &freq_scale,   sizeof(float));
    memcpy(params +  7, &ext_factor,   sizeof(float));
    memcpy(params +  8, &attn_factor,  sizeof(float));
    memcpy(params +  9, &beta_fast,    sizeof(float));
    memcpy(params + 10, &beta_slow,    sizeof(float));
    memcpy(&params[11], sections,      sizeof(int)*4);
    ggml_set_op_params(result, params, sizeof(params));

    result->op   = GGML_OP_ROPE;
    result->src[0] = a;
    result->src[1] = b;
    result->src[2] = c;

    return result;
}